

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall tonk::gateway::StateMachine::Initialize(StateMachine *this)

{
  ostringstream *this_00;
  uint64_t uVar1;
  OutputWorker *this_01;
  Result result;
  uint64_t seed [2];
  Result local_1b0;
  long local_1a8;
  long local_1a0;
  undefined1 local_198 [392];
  
  SecureRandom_Next((tonk *)&local_1b0,(uint8_t *)&local_1a8,0x10);
  if ((local_1b0.Error != (ErrorResult *)0x0) && (DAT_001b8e60 < 4)) {
    this_00 = (ostringstream *)(local_198 + 0x10);
    local_198._0_8_ = ModuleLogger;
    local_198._8_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,DAT_001b8e90,DAT_001b8e98)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"SecureRandom failed to generate random seed",0x2b);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_198);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  uVar1 = local_1a8 * 2 + 1;
  (this->Rand).Inc = uVar1;
  (this->Rand).State = (local_1a0 + uVar1) * 0x5851f42d4c957f2d + 1 + local_1a8 * 2;
  Result::~Result(&local_1b0);
  return;
}

Assistant:

void StateMachine::Initialize()
{
    uint64_t seed[2];
    Result result = SecureRandom_Next((uint8_t*)&seed[0], sizeof(seed));
    if (result.IsFail()) {
        ModuleLogger.Warning("SecureRandom failed to generate random seed");
    }
    Rand.Seed(seed[0], seed[1]);
}